

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O0

int __thiscall TcpServer::addToWrite(TcpServer *this,int fd)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  epoll_event *__event;
  epoll_event *event;
  TcpServer *pTStack_18;
  int fd_local;
  TcpServer *this_local;
  
  event._4_4_ = fd;
  pTStack_18 = this;
  bVar1 = isVaildConnection(this,fd);
  if (bVar1) {
    pmVar3 = std::
             map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
             ::operator[](&this->connections,(key_type *)((long)&event + 4));
    __event = &pmVar3->event;
    __event->events = __event->events | 4;
    (pmVar3->event).data.fd = event._4_4_;
    iVar2 = epoll_ctl(this->epollFd,3,event._4_4_,(epoll_event *)__event);
    if (iVar2 == -1) {
      recordError(this,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                  ,0x19c);
      Logger::printLog(&logger,LOG_ERROR,&this->errorString,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                       ,0x19d);
      this_local._4_4_ = -1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int addToWrite(int fd) {
    if (!isVaildConnection(fd)) {
      return 0;
    }
    auto &event = connections[fd].event;
    // printEvent(-1, event.events);
    event.events |= EPOLLOUT;
    event.data.fd = fd;
    if (epoll_ctl(epollFd, EPOLL_CTL_MOD, fd, &event) == -1) {
      recordError(__FILE__, __LINE__);
      Log(logger, Logger::LOG_ERROR, errorString);
      return -1;
    }
    return 0;
  }